

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_inference.cc
# Opt level: O3

statement_type_t tchecker::type_assign(expression_type_t ltype,expression_type_t rtype)

{
  bool bVar1;
  statement_type_t sVar2;
  
  bVar1 = integer_assignable(ltype);
  if ((bVar1) && (bVar1 = integer_valued(rtype), bVar1)) {
    return STMT_TYPE_INTASSIGN;
  }
  bVar1 = clock_assignable(ltype);
  if ((bVar1) && (bVar1 = integer_valued(rtype), bVar1)) {
    return STMT_TYPE_CLKASSIGN_INT;
  }
  bVar1 = clock_assignable(ltype);
  if ((bVar1) && (bVar1 = clock_valued(rtype), bVar1)) {
    return STMT_TYPE_CLKASSIGN_CLK;
  }
  bVar1 = clock_assignable(ltype);
  sVar2 = (uint)bVar1 + (uint)bVar1 * 4;
  if (rtype != EXPR_TYPE_INTCLKSUM) {
    sVar2 = STMT_TYPE_BAD;
  }
  return sVar2;
}

Assistant:

enum tchecker::statement_type_t type_assign(enum tchecker::expression_type_t ltype, enum tchecker::expression_type_t rtype)
{
  if (integer_assignable(ltype) && integer_valued(rtype))
    return tchecker::STMT_TYPE_INTASSIGN;

  if (clock_assignable(ltype) && integer_valued(rtype))
    return tchecker::STMT_TYPE_CLKASSIGN_INT;

  if (clock_assignable(ltype) && clock_valued(rtype))
    return tchecker::STMT_TYPE_CLKASSIGN_CLK;

  if (clock_assignable(ltype) && (rtype == tchecker::EXPR_TYPE_INTCLKSUM))
    return tchecker::STMT_TYPE_CLKASSIGN_SUM;

  return tchecker::STMT_TYPE_BAD;
}